

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O1

bool CoreML::Specification::GLMClassifier_ClassEncoding_IsValid(int value)

{
  return (uint)value < 2;
}

Assistant:

bool GLMClassifier_ClassEncoding_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
      return true;
    default:
      return false;
  }
}